

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O2

void __thiscall rsg::VariableType::~VariableType(VariableType *this)

{
  VariableType *this_00;
  
  this_00 = this->m_elementType;
  if (this_00 != (VariableType *)0x0) {
    ~VariableType(this_00);
  }
  operator_delete(this_00,0x50);
  std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::~vector
            (&this->m_members);
  std::__cxx11::string::~string((string *)&this->m_typeName);
  return;
}

Assistant:

inline VariableType::~VariableType (void)
{
	delete m_elementType;
}